

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Btree * sqlite3DbNameToBtree(sqlite3 *db,char *zDbName)

{
  byte bVar1;
  Db *pDVar2;
  byte *pbVar3;
  long lVar4;
  uchar *b;
  byte *pbVar5;
  
  if ((long)db->nDb < 1) {
    return (Btree *)0x0;
  }
  pDVar2 = db->aDb;
  lVar4 = 0;
  do {
    if (pDVar2[lVar4].pBt != (Btree *)0x0) {
      if (zDbName == (char *)0x0) {
LAB_00155193:
        return pDVar2[lVar4].pBt;
      }
      pbVar5 = (byte *)pDVar2[lVar4].zName;
      bVar1 = *zDbName;
      pbVar3 = (byte *)(zDbName + 1);
      while ((bVar1 != 0 && (""[bVar1] == ""[*pbVar5]))) {
        pbVar5 = pbVar5 + 1;
        bVar1 = *pbVar3;
        pbVar3 = pbVar3 + 1;
      }
      if (""[bVar1] == ""[*pbVar5]) goto LAB_00155193;
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == db->nDb) {
      return (Btree *)0x0;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE Btree *sqlite3DbNameToBtree(sqlite3 *db, const char *zDbName){
  int i;
  for(i=0; i<db->nDb; i++){
    if( db->aDb[i].pBt
     && (zDbName==0 || sqlite3StrICmp(zDbName, db->aDb[i].zName)==0)
    ){
      return db->aDb[i].pBt;
    }
  }
  return 0;
}